

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_findfile.c
# Opt level: O1

char * findfile(char *fname,int dotscore)

{
  __uid_t __uid;
  char *home;
  passwd *ppVar1;
  long lVar2;
  char *pcVar3;
  char *unaff_R14;
  bool bVar4;
  
  if (*fname != '\0') {
    pcVar3 = "CURL_HOME";
    lVar2 = 0;
    do {
      pcVar3 = (char *)curl_getenv(pcVar3);
      if (pcVar3 == (char *)0x0) {
        bVar4 = false;
      }
      else {
        if (*pcVar3 == '\0') {
          curl_free(pcVar3);
        }
        else {
          home = pcVar3;
          if (*(long *)((long)&conf_list[0].append + lVar2) != 0) {
            home = (char *)curl_maprintf("%s%s",pcVar3);
            curl_free(pcVar3);
            if (home == (char *)0x0) {
              bVar4 = true;
              unaff_R14 = (char *)0x0;
              goto LAB_0010d738;
            }
          }
          pcVar3 = fname;
          if (((&conf_list[0].withoutdot)[lVar2] != true) ||
             (bVar4 = dotscore != 0, dotscore = 0, pcVar3 = fname + 1, bVar4)) {
            pcVar3 = checkhome(home,pcVar3,1 < (uint)dotscore);
            curl_free(home);
            bVar4 = pcVar3 != (char *)0x0;
            if (bVar4) {
              unaff_R14 = pcVar3;
            }
            goto LAB_0010d738;
          }
          curl_free(home);
          dotscore = 0;
        }
        bVar4 = false;
      }
LAB_0010d738:
      if (bVar4) {
        return unaff_R14;
      }
      pcVar3 = *(char **)((long)&conf_list[1].env + lVar2);
      lVar2 = lVar2 + 0x18;
    } while (lVar2 != 0x78);
    __uid = geteuid();
    ppVar1 = getpwuid(__uid);
    if (((ppVar1 != (passwd *)0x0) && (pcVar3 = ppVar1->pw_dir, pcVar3 != (char *)0x0)) &&
       (*pcVar3 != '\0')) {
      pcVar3 = checkhome(pcVar3,fname,false);
      return pcVar3;
    }
  }
  return (char *)0x0;
}

Assistant:

char *findfile(const char *fname, int dotscore)
{
  int i;
  DEBUGASSERT(fname && fname[0]);
  DEBUGASSERT((dotscore != 1) || (fname[0] == '.'));

  if(!fname[0])
    return NULL;

  for(i = 0; conf_list[i].env; i++) {
    char *home = curl_getenv(conf_list[i].env);
    if(home) {
      char *path;
      const char *filename = fname;
      if(!home[0]) {
        curl_free(home);
        continue;
      }
      if(conf_list[i].append) {
        char *c = aprintf("%s%s", home, conf_list[i].append);
        curl_free(home);
        if(!c)
          return NULL;
        home = c;
      }
      if(conf_list[i].withoutdot) {
        if(!dotscore) {
          /* this is not looking for .curlrc, or the XDG_CONFIG_HOME was
             defined so we skip the extended check */
          curl_free(home);
          continue;
        }
        filename++; /* move past the leading dot */
        dotscore = 0; /* disable it for this check */
      }
      path = checkhome(home, filename, dotscore ? dotscore - 1 : 0);
      curl_free(home);
      if(path)
        return path;
    }
  }
#if defined(HAVE_GETPWUID) && defined(HAVE_GETEUID)
  {
    struct passwd *pw = getpwuid(geteuid());
    if(pw) {
      char *home = pw->pw_dir;
      if(home && home[0])
        return checkhome(home, fname, FALSE);
    }
  }
#endif /* PWD-stuff */
  return NULL;
}